

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O2

void __thiscall
nodecpp::platform::internal_msg::InternalMsg::append(InternalMsg *this,void *buff_,size_t sz)

{
  void *pvVar1;
  ulong uVar2;
  uint8_t *__dest;
  ulong __n;
  anon_class_8_1_8991fb9c local_40;
  void *local_38;
  
  local_38 = buff_;
  while( true ) {
    if (sz == 0) {
      return;
    }
    if ((this->currentPage).ptr == (uint8_t *)0x0) {
      if (this->totalSz == 0) {
        local_40.this = this;
        assert::
        nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::append(void_const*,unsigned_long)::_lambda()_1_>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                   ,0x1ef,&local_40,"currentPage.page() == nullptr");
        reserveSpaceForConvertionToTag(this);
      }
      else {
        implAddPage(this);
      }
      local_40.this = this;
      assert::
      nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::append(void_const*,unsigned_long)::_lambda()_2_>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0x1f2,&local_40,"currentPage.page() != nullptr");
    }
    pvVar1 = local_38;
    uVar2 = (ulong)((uint)this->totalSz & 0xfff);
    __n = 0x1000 - uVar2;
    __dest = (this->currentPage).ptr + uVar2;
    if (sz < __n || sz - __n == 0) break;
    memcpy(__dest,local_38,__n);
    local_38 = (void *)((long)pvVar1 + __n);
    this->totalSz = this->totalSz + __n;
    local_40.this = this;
    assert::
    nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::append(void_const*,unsigned_long)::_lambda()_4_>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
               ,0x206,&local_40,"offsetInCurrentPage() == 0");
    (this->currentPage).ptr = (uint8_t *)0x0;
    sz = sz - __n;
  }
  memcpy(__dest,local_38,sz);
  this->totalSz = this->totalSz + sz;
  if (sz != __n) {
    return;
  }
  local_40.this = this;
  assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::append(void_const*,unsigned_long)::_lambda()_3_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
             ,0x1fb,&local_40,"offsetInCurrentPage() == 0");
  (this->currentPage).ptr = (uint8_t *)0x0;
  return;
}

Assistant:

void append( const void* buff_, size_t sz )
		{
			const uint8_t* buff = reinterpret_cast<const uint8_t*>(buff_);
			while( sz != 0 )
			{
				if ( currentPage.page() == nullptr )
				{
					if ( totalSz )
						implAddPage();
					else
					{
						NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() == nullptr );
						reserveSpaceForConvertionToTag();
					}
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() != nullptr );
				}
				size_t remainingInPage = remainingSizeInCurrentPage();
				if ( sz <= remainingInPage )
				{
					memcpy( currentPage.page() + offsetInCurrentPage(), buff, sz );
					totalSz += sz;
					if( sz == remainingInPage )
					{
						NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
						currentPage.init();
					}
					break;
				}
				else
				{
					memcpy( currentPage.page() + offsetInCurrentPage(), buff, remainingInPage );
					sz -= remainingInPage;
					buff += remainingInPage;
					totalSz += remainingInPage;
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
					currentPage.init();
				}
			}
		}